

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void RD4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long in_RDI;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 auVar5 [16];
  __m128i abcdefg;
  __m128i avg2;
  __m128i lsb;
  __m128i avg1;
  __m128i JIXABCD__;
  __m128i KJIXABCD_;
  __m128i LKJIXABCD;
  __m128i LKJI_____;
  uint32_t L;
  uint32_t K;
  uint32_t J;
  uint32_t I;
  __m128i ____XABCD;
  __m128i XABCD;
  __m128i one;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_198;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  
  uVar1 = *(ulong *)(in_RDI + -0x21);
  uVar10 = *(undefined1 *)(in_RDI + -1);
  uVar12 = *(undefined1 *)(in_RDI + 0x1f);
  uVar14 = *(undefined1 *)(in_RDI + 0x3f);
  local_198 = (ulong)CONCAT13(uVar10,CONCAT12(uVar12,CONCAT11(uVar14,*(undefined1 *)(in_RDI + 0x5f))
                                             ));
  local_198 = local_198 | uVar1 << 0x20;
  auVar5._8_8_ = uVar1 >> 0x20;
  auVar5._0_8_ = local_198;
  local_248 = auVar5._2_8_;
  uStack_240 = uVar1 >> 0x30;
  uStack_16 = (undefined1)uVar1;
  uStack_15 = (undefined1)(uVar1 >> 8);
  uStack_14 = (undefined1)(uVar1 >> 0x10);
  uStack_13 = (undefined1)(uVar1 >> 0x18);
  uStack_12 = (undefined1)(uVar1 >> 0x20);
  uStack_11 = (undefined1)(uVar1 >> 0x28);
  uStack_10 = (undefined1)(uVar1 >> 0x30);
  uStack_f = (undefined1)(uVar1 >> 0x38);
  uVar4 = pavgb(uVar12,*(undefined1 *)(in_RDI + 0x5f));
  uVar6 = pavgb(uVar10,uVar14);
  uVar7 = pavgb(uStack_16,uVar12);
  uVar8 = pavgb(uStack_15,uVar10);
  uVar9 = pavgb(uStack_14,uStack_16);
  uVar11 = pavgb(uStack_13,uStack_15);
  uVar13 = pavgb(uStack_12,uStack_14);
  uVar15 = pavgb(uStack_11,uStack_13);
  uVar16 = pavgb(uStack_10,uStack_12);
  uVar17 = pavgb(uStack_f,uStack_11);
  uVar18 = pavgb(0,uStack_10);
  uVar19 = pavgb(0,uStack_f);
  uVar20 = pavgb(0,0);
  uVar21 = pavgb(0,0);
  uVar22 = pavgb(0,0);
  uVar23 = pavgb(0,0);
  auVar3[1] = uVar6;
  auVar3[0] = uVar4;
  auVar3[2] = uVar7;
  auVar3[3] = uVar8;
  auVar3[4] = uVar9;
  auVar3[5] = uVar11;
  auVar3[6] = uVar13;
  auVar3[7] = uVar15;
  auVar3[9] = uVar17;
  auVar3[8] = uVar16;
  auVar3[10] = uVar18;
  auVar3[0xb] = uVar19;
  auVar3[0xc] = uVar20;
  auVar3[0xd] = uVar21;
  auVar3[0xe] = uVar22;
  auVar3[0xf] = uVar23;
  auVar2._8_8_ = (uStack_240 ^ uVar1 >> 0x20) & 0x101010101010101;
  auVar2._0_8_ = (local_248 ^ local_198) & 0x101010101010101;
  auVar5 = psubusb(auVar3,auVar2);
  local_38 = auVar5[0];
  uStack_37 = auVar5[1];
  uStack_36 = auVar5[2];
  uStack_35 = auVar5[3];
  uStack_34 = auVar5[4];
  uStack_33 = auVar5[5];
  uStack_32 = auVar5[6];
  uStack_31 = auVar5[7];
  uStack_30 = auVar5[8];
  uStack_2f = auVar5[9];
  uStack_2e = auVar5[10];
  uStack_2d = auVar5[0xb];
  uStack_2c = auVar5[0xc];
  uStack_2b = auVar5[0xd];
  uStack_2a = auVar5[0xe];
  uStack_29 = auVar5[0xf];
  pavgb(local_38,uVar14);
  pavgb(uStack_37,uVar12);
  pavgb(uStack_36,uVar10);
  pavgb(uStack_35,uStack_16);
  uVar10 = pavgb(uStack_34,uStack_15);
  uVar12 = pavgb(uStack_33,uStack_14);
  uVar14 = pavgb(uStack_32,uStack_13);
  uVar4 = pavgb(uStack_31,uStack_12);
  uVar6 = pavgb(uStack_30,uStack_11);
  uVar7 = pavgb(uStack_2f,uStack_10);
  uVar8 = pavgb(uStack_2e,uStack_f);
  uVar9 = pavgb(uStack_2d,0);
  uVar11 = pavgb(uStack_2c,0);
  uVar13 = pavgb(uStack_2b,0);
  uVar15 = pavgb(uStack_2a,0);
  uVar16 = pavgb(uStack_29,0);
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar13,CONCAT14(uVar11,CONCAT13(uVar9,
                                                  CONCAT12(uVar8,CONCAT11(uVar7,uVar6))))))),
                 CONCAT13(uVar4,CONCAT12(uVar14,CONCAT11(uVar12,uVar10))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar13,CONCAT14(uVar11,CONCAT13(uVar9,
                                                  CONCAT12(uVar8,CONCAT11(uVar7,uVar6))))))),
                 CONCAT13(uVar4,CONCAT12(uVar14,CONCAT11(uVar12,uVar10))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar13,CONCAT14(uVar11,CONCAT13(uVar9,
                                                  CONCAT12(uVar8,CONCAT11(uVar7,uVar6))))))),
                 CONCAT13(uVar4,CONCAT12(uVar14,CONCAT11(uVar12,uVar10))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar13,CONCAT14(uVar11,CONCAT13(uVar9,
                                                  CONCAT12(uVar8,CONCAT11(uVar7,uVar6))))))),
                 CONCAT13(uVar4,CONCAT12(uVar14,CONCAT11(uVar12,uVar10))));
  return;
}

Assistant:

static void RD4_SSE2(uint8_t* dst) {   // Down-right
  const __m128i one = _mm_set1_epi8(1);
  const __m128i XABCD = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i ____XABCD = _mm_slli_si128(XABCD, 4);
  const uint32_t I = dst[-1 + 0 * BPS];
  const uint32_t J = dst[-1 + 1 * BPS];
  const uint32_t K = dst[-1 + 2 * BPS];
  const uint32_t L = dst[-1 + 3 * BPS];
  const __m128i LKJI_____ =
      _mm_cvtsi32_si128((int)(L | (K << 8) | (J << 16) | (I << 24)));
  const __m128i LKJIXABCD = _mm_or_si128(LKJI_____, ____XABCD);
  const __m128i KJIXABCD_ = _mm_srli_si128(LKJIXABCD, 1);
  const __m128i JIXABCD__ = _mm_srli_si128(LKJIXABCD, 2);
  const __m128i avg1 = _mm_avg_epu8(JIXABCD__, LKJIXABCD);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(JIXABCD__, LKJIXABCD), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i abcdefg = _mm_avg_epu8(avg2, KJIXABCD_);
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(               abcdefg    ));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 1)));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 2)));
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 3)));
}